

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O1

UStringTrieResult __thiscall icu_63::BytesTrie::next(BytesTrie *this,int32_t inByte)

{
  byte bVar1;
  UStringTrieResult UVar2;
  int iVar3;
  UStringTrieResult UVar4;
  uint inByte_00;
  byte *pbVar5;
  byte *pos;
  
  pbVar5 = this->pos_;
  UVar2 = USTRINGTRIE_NO_MATCH;
  if (pbVar5 != (byte *)0x0) {
    inByte_00 = ((uint)inByte >> 0x17 & 0x100) + inByte;
    iVar3 = this->remainingMatchLength_;
    if (iVar3 < 0) {
      do {
        pos = pbVar5 + 1;
        bVar1 = *pbVar5;
        if (bVar1 < 0x10) {
          UVar2 = branchNext(this,pos,(uint)bVar1,inByte_00);
          iVar3 = 1;
        }
        else if (bVar1 < 0x20) {
          pos = pbVar5 + 2;
          iVar3 = 2;
          if (pbVar5[1] == inByte_00) {
            this->remainingMatchLength_ = bVar1 - 0x11;
            this->pos_ = pos;
            if ((bVar1 == 0x10) && (0x1f < *pos)) {
              UVar2 = *pos & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
              iVar3 = 1;
            }
            else {
              UVar2 = USTRINGTRIE_NO_VALUE;
              iVar3 = 1;
            }
          }
        }
        else {
          iVar3 = 2;
          if ((bVar1 & 1) == 0) {
            iVar3 = 0;
            if (0xa1 < bVar1) {
              if (bVar1 < 0xd8) {
                pos = pbVar5 + 2;
                iVar3 = 0;
              }
              else if (bVar1 < 0xfc) {
                pos = pbVar5 + 3;
                iVar3 = 0;
              }
              else {
                pos = pbVar5 + (ulong)((bVar1 >> 1 & 1) != 0) + 4;
                iVar3 = 0;
              }
            }
          }
        }
        pbVar5 = pos;
      } while (iVar3 == 0);
      if (iVar3 != 1) {
        this->pos_ = (uint8_t *)0x0;
        UVar2 = USTRINGTRIE_NO_MATCH;
      }
      return UVar2;
    }
    if (inByte_00 == *pbVar5) {
      UVar2 = USTRINGTRIE_NO_VALUE;
      this->remainingMatchLength_ = iVar3 + -1;
      this->pos_ = pbVar5 + 1;
      if ((iVar3 == 0) && (UVar4 = (UStringTrieResult)pbVar5[1], 0x1f < UVar4)) {
        return UVar4 & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
      }
    }
    else {
      this->pos_ = (uint8_t *)0x0;
    }
  }
  return UVar2;
}

Assistant:

UStringTrieResult
BytesTrie::next(int32_t inByte) {
    const uint8_t *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    }
    if(inByte<0) {
        inByte+=0x100;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    if(length>=0) {
        // Remaining part of a linear-match node.
        if(inByte==*pos++) {
            remainingMatchLength_=--length;
            pos_=pos;
            int32_t node;
            return (length<0 && (node=*pos)>=kMinValueLead) ?
                    valueResult(node) : USTRINGTRIE_NO_VALUE;
        } else {
            stop();
            return USTRINGTRIE_NO_MATCH;
        }
    }
    return nextImpl(pos, inByte);
}